

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O1

void __thiscall PFData_test_setIndexOrder_Test::TestBody(PFData_test_setIndexOrder_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  string *message;
  char *pcVar4;
  int i;
  long lVar5;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar;
  PFData test_read;
  PFData test;
  double data [24];
  AssertHelper local_3c0;
  undefined8 *local_3b8;
  string local_3b0;
  AssertHelper local_390;
  PFData local_388;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  PFData local_180;
  double local_d8 [24];
  
  lVar5 = 0;
  memset(&local_180,0,0xa8);
  PFData::PFData(&local_180);
  do {
    iVar3 = rand();
    local_d8[lVar5] = (double)iVar3 / 1000.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x18);
  PFData::setData(&local_180,local_d8);
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"zyx\"",&local_388.m_filename,
             (char (*) [4])"zyx");
  paVar1 = &local_388.m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ba,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"xyz","");
  PFData::setIndexOrder(&local_180,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2be,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"xYz","");
  PFData::setIndexOrder(&local_180,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2c2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"xYZ","");
  PFData::setIndexOrder(&local_180,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2c6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"XYZ","");
  PFData::setIndexOrder(&local_180,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ca,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"XYZZZZ","");
  PFData::setIndexOrder(&local_180,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ce,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"abc","");
  PFData::setIndexOrder(&local_180,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_3b0,"test.getIndexOrder()","\"xyz\"",&local_388.m_filename,
             (char (*) [4])"xyz");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                  (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                             (char)local_388.m_filename._M_dataplus._M_p));
  }
  if ((char)local_3b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_388);
    if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_3b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2d2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                         (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                     (char)local_388.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  sVar2 = local_3b0._M_string_length;
  if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_3b0._M_string_length !=
        (undefined8 *)(local_3b0._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_3b0._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"tests/test_write_index_order.pfb","");
  local_3b0._M_dataplus._M_p._0_4_ = PFData::writeFile(&local_180,&local_260);
  local_3c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_388,"test.writeFile(\"tests/test_write_index_order.pfb\")","1",
             (int *)&local_3b0,(int *)&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  sVar2 = local_388.m_filename._M_string_length;
  if ((char)local_388.m_filename._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388.m_filename._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2d5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
  }
  else {
    if ((undefined8 *)local_388.m_filename._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_388.m_filename._M_string_length !=
          (undefined8 *)(local_388.m_filename._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_388.m_filename._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ZYX","");
    PFData::setIndexOrder(&local_180,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&local_3b0,"test.getIndexOrder()","\"zyx\"",&local_388.m_filename,
               (char (*) [4])"zyx");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                    (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                               (char)local_388.m_filename._M_dataplus._M_p));
    }
    if ((char)local_3b0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_388);
      if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_3b0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                 ,0x2d9,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                           (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                       (char)local_388.m_filename._M_dataplus._M_p) + 8))();
      }
    }
    sVar2 = local_3b0._M_string_length;
    if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_3b0._M_string_length !=
          (undefined8 *)(local_3b0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_3b0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"zYx","");
    PFData::setIndexOrder(&local_180,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    PFData::getIndexOrder_abi_cxx11_(&local_388.m_filename,&local_180);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&local_3b0,"test.getIndexOrder()","\"zyx\"",&local_388.m_filename,
               (char (*) [4])"zyx");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                    (char)local_388.m_filename._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                               (char)local_388.m_filename._M_dataplus._M_p));
    }
    if ((char)local_3b0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_388);
      if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_3b0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                 ,0x2dd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      if ((long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                           (char)local_388.m_filename._M_dataplus._M_p) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_388.m_filename._M_dataplus._M_p._1_7_,
                                       (char)local_388.m_filename._M_dataplus._M_p) + 8))();
      }
    }
    sVar2 = local_3b0._M_string_length;
    if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_3b0._M_string_length !=
          (undefined8 *)(local_3b0._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_3b0._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c0,"tests/test_write_index_order.pfb","");
    local_3b0._M_dataplus._M_p._0_4_ = PFData::writeFile(&local_180,&local_2c0);
    local_3c0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_388,"test.writeFile(\"tests/test_write_index_order.pfb\")","0",
               (int *)&local_3b0,(int *)&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if ((char)local_388.m_filename._M_dataplus._M_p != '\0') {
      if ((undefined8 *)local_388.m_filename._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_388.m_filename._M_string_length !=
            (undefined8 *)(local_388.m_filename._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_388.m_filename._M_string_length);
        }
        operator_delete((void *)local_388.m_filename._M_string_length);
      }
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e0,"tests/test_write_index_order.pfb","");
      PFData::PFData(&local_388,&local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      PFData::loadHeader(&local_388);
      PFData::loadData(&local_388);
      PFData::getIndexOrder_abi_cxx11_(&local_3b0,&local_388);
      iVar3 = 0x14a174;
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)&local_3c0,"\"zyx\"","test_read.getIndexOrder()",(char (*) [4])"zyx",
                 &local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p) !=
          &local_3b0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p));
      }
      if (local_3c0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3b0);
        if (local_3b8 == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (char *)*local_3b8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                   ,0x2e6,pcVar4);
        message = &local_3b0;
        testing::internal::AssertHelper::operator=(&local_390,(Message *)message);
        iVar3 = (int)message;
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        if ((long *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,
                                         (int)local_3b0._M_dataplus._M_p) + 8))();
        }
      }
      if (local_3b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_3b8 != local_3b8 + 2) {
          operator_delete((undefined8 *)*local_3b8);
        }
        operator_delete(local_3b8);
      }
      PFData::close(&local_180,iVar3);
      PFData::close(&local_388,iVar3);
      local_3c0.data_._0_4_ = 0;
      local_390.data_._0_4_ = remove("tests/test_write_index_order.pfb");
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_3b0,"0","remove(\"tests/test_write_index_order.pfb\")",
                 (int *)&local_3c0,(int *)&local_390);
      if ((char)local_3b0._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_3c0);
        if ((undefined8 *)local_3b0._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_3b0._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                   ,0x2ea,pcVar4);
        testing::internal::AssertHelper::operator=(&local_390,(Message *)&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        if ((long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) + 8))();
        }
      }
      if ((undefined8 *)local_3b0._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_3b0._M_string_length !=
            (undefined8 *)(local_3b0._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_3b0._M_string_length);
        }
        operator_delete((void *)local_3b0._M_string_length);
      }
      PFData::~PFData(&local_388);
      goto LAB_0011c675;
    }
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388.m_filename._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2e0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_3c0);
  if ((long *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_3b0._M_dataplus._M_p._4_4_,(int)local_3b0._M_dataplus._M_p)
                + 8))();
  }
  if ((undefined8 *)local_388.m_filename._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_388.m_filename._M_string_length !=
        (undefined8 *)(local_388.m_filename._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_388.m_filename._M_string_length);
    }
    operator_delete((void *)local_388.m_filename._M_string_length);
  }
LAB_0011c675:
  PFData::~PFData(&local_180);
  return;
}

Assistant:

TEST_F(PFData_test, setIndexOrder) {
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++) {
        data[i] = (double) rand() / 1000;
    }
    test.setData(data);

    // Should equal "zyz"
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "xyz"
    test.setIndexOrder("xyz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZZZZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not work, should still equal "xyz"
    test.setIndexOrder("abc");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not be able to write to file when indexOrder == "xyz"
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 1);

    // Should equal "zyx"
    test.setIndexOrder("ZYX");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "zyx"
    test.setIndexOrder("zYx");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should be able to write to file
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 0);

    // Read file, indexOrder should equal "zyx"
    PFData test_read = PFData("tests/test_write_index_order.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ("zyx", test_read.getIndexOrder());

    test.close();
    test_read.close();
    ASSERT_EQ(0, remove("tests/test_write_index_order.pfb"));
}